

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

void __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::image::(anonymous_namespace)::CaseDef>_>
::initPrograms(InstanceFactory1<vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::image::(anonymous_namespace)::CaseDef>_>
               *this,SourceCollections *dst)

{
  SourceCollections *dst_local;
  InstanceFactory1<vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>,_vkt::FunctionInstance1<vkt::image::(anonymous_namespace)::CaseDef>::Args,_vkt::FunctionPrograms1<vkt::image::(anonymous_namespace)::CaseDef>_>
  *this_local;
  
  FunctionPrograms1<vkt::image::(anonymous_namespace)::CaseDef>::init
            (&this->m_progs,(EVP_PKEY_CTX *)dst);
  return;
}

Assistant:

void			initPrograms		(vk::SourceCollections& dst) const { m_progs.init(dst, m_arg0); }